

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O3

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,array<idx2::stref> *Vals)

{
  char *__s;
  byte *pbVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  cstr Temp;
  bool bVar9;
  
  if (NArgs < 2) {
    return false;
  }
  uVar2 = (ulong)(uint)NArgs;
  uVar6 = 2;
  while (iVar3 = strncmp(Args[uVar6 - 1],Opt,0x20), iVar3 != 0) {
    bVar9 = uVar6 == uVar2;
    uVar6 = uVar6 + 1;
    if (bVar9) {
      return false;
    }
  }
  uVar8 = (uint)uVar6;
  if ((int)uVar8 < NArgs) {
    do {
      __s = Args[uVar6];
      uVar7 = uVar6;
      if (*__s == '-') break;
      sVar4 = strlen(__s);
      lVar5 = Vals->Size;
      if (Vals->Capacity <= lVar5) {
        GrowCapacity<idx2::stref>(Vals,0);
        lVar5 = Vals->Size;
      }
      Vals->Size = lVar5 + 1;
      pbVar1 = (Vals->Buffer).Data;
      *(char **)(pbVar1 + lVar5 * 0x10) = __s;
      *(int *)(pbVar1 + lVar5 * 0x10 + 8) = (int)sVar4;
      uVar6 = uVar6 + 1;
      uVar7 = uVar2;
    } while (uVar2 != uVar6);
  }
  else {
    uVar7 = uVar6 & 0xffffffff;
  }
  return uVar8 < (uint)uVar7;
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, array<stref>* Vals)
{
  for (i32 I = 1; I < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      i32 J = I + 1;
      while (J < NArgs && Args[J][0] != '-')
      {
        cstr Temp;
        Temp = Args[J];
        stref Str = stref(Temp);
        PushBack(Vals, Str);
        ++J;
      }
      return J > I + 1;
    }
  }
  return false;
}